

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double_to_string_tests.cpp
# Opt level: O3

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
float_to_string<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,double val,int precision)

{
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  writer;
  write_double print;
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_50;
  write_double local_48;
  
  jsoncons::detail::write_double::write_double(&local_48,general,precision);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  local_50.buf_ptr = __return_storage_ptr__;
  jsoncons::detail::write_double::operator()(&local_48,val,&local_50);
  if (local_48.to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.to_double_.buffer_.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.to_double_.buffer_.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT> float_to_string(double val, int precision)
{
    jsoncons::detail::write_double print(float_chars_format::general,precision);

    std::basic_string<CharT> s;
    jsoncons::string_sink<std::basic_string<CharT>> writer(s);
    print(val, writer);
    writer.flush();
    return s;
}